

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedPipelineStateImpl.cpp
# Opt level: O3

void __thiscall
Diligent::SerializedPipelineStateImpl::Initialize<Diligent::ComputePipelineStateCreateInfo>
          (SerializedPipelineStateImpl *this,ComputePipelineStateCreateInfo *CreateInfo,
          PipelineStateArchiveInfo *ArchiveInfo)

{
  SignaturesVector *this_00;
  SerializedResourceSignatureImpl *pSVar1;
  IPipelineResourceSignature *pIVar2;
  pointer pRVar3;
  ARCHIVE_DEVICE_DATA_FLAGS AVar4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  IMemoryAllocator *Allocator;
  size_t Size;
  char (*Args_1) [14];
  SerializedResourceSignatureImpl **ppSVar7;
  IPipelineResourceSignature *pObj;
  ARCHIVE_DEVICE_DATA_FLAGS AVar8;
  Uint32 UVar9;
  long lVar10;
  bool bVar11;
  string msg_1;
  string msg;
  IPipelineResourceSignature *DefaultSignatures [1];
  Serializer<(Diligent::SerializerMode)2> Ser;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  char *local_78;
  char *pcStack_70;
  char *local_68;
  char *pcStack_60;
  SerializedResourceSignatureImpl *local_50;
  Serializer<(Diligent::SerializerMode)2> local_48;
  
  AVar8 = ArchiveInfo->DeviceFlags;
  AVar4 = AVar8 & ~ARCHIVE_DEVICE_DATA_FLAG_GLES;
  if ((~AVar8 & 0xc) != 0) {
    AVar4 = AVar8;
  }
  (this->m_Data).Aux.NoShaderReflection =
       (bool)((char)ArchiveInfo->PSOFlags & PSO_ARCHIVE_FLAG_STRIP_REFLECTION);
  if (AVar4 != ARCHIVE_DEVICE_DATA_FLAG_NONE) {
    do {
      AVar8 = -AVar4 & AVar4;
      uVar5 = AVar8 << 0x1e | AVar8 >> 2;
      if (uVar5 - 1 < 2) {
        PatchShadersGL<Diligent::ComputePipelineStateCreateInfo>(this,CreateInfo);
      }
      else {
        if (uVar5 == 0) {
          FormatString<char[53]>
                    ((string *)local_98,
                     (char (*) [53])"ARCHIVE_DEVICE_DATA_FLAG_NONE (0) should never occur");
          DebugAssertionFailed
                    ((Char *)local_98._0_8_,"Initialize",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
                     ,0xeb);
        }
        else {
          if (uVar5 == 4) {
            PatchShadersVk<Diligent::ComputePipelineStateCreateInfo>(this,CreateInfo);
            goto LAB_001ca261;
          }
          FormatString<char[30]>((string *)local_98,(char (*) [30])"Unexpected render device type");
          if (DebugMessageCallback != (undefined *)0x0) {
            (*(code *)DebugMessageCallback)(2,local_98._0_8_,0,0,0);
          }
        }
        if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
          operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
        }
      }
LAB_001ca261:
      bVar11 = AVar8 != AVar4;
      AVar4 = AVar8 ^ AVar4;
    } while (bVar11);
  }
  if ((this->m_Data).Common.m_Ptr == (void *)0x0) {
    UVar9 = (CreateInfo->super_PipelineStateCreateInfo).ResourceSignaturesCount;
    if (UVar9 == 0) {
      if ((ArchiveInfo->DeviceFlags & (ARCHIVE_DEVICE_DATA_FLAG_GLES|ARCHIVE_DEVICE_DATA_FLAG_GL))
          == ARCHIVE_DEVICE_DATA_FLAG_NONE) {
        UVar9 = 0;
      }
      else {
        PrepareDefaultSignatureGL<Diligent::ComputePipelineStateCreateInfo>(this,CreateInfo);
        UVar9 = (CreateInfo->super_PipelineStateCreateInfo).ResourceSignaturesCount;
      }
    }
    else {
      (this->m_Data).DoNotPackSignatures = (bool)((byte)(char)ArchiveInfo->PSOFlags >> 1 & 1);
    }
    ppSVar7 = (SerializedResourceSignatureImpl **)
              (CreateInfo->super_PipelineStateCreateInfo).ppResourceSignatures;
    local_50 = (SerializedResourceSignatureImpl *)0x0;
    pSVar1 = (this->m_pDefaultSignature).m_pObject;
    if (pSVar1 != (SerializedResourceSignatureImpl *)0x0) {
      ppSVar7 = &local_50;
      UVar9 = 1;
      local_50 = pSVar1;
    }
    local_68 = (char *)0x0;
    pcStack_60 = (char *)0x0;
    local_78 = (char *)0x0;
    pcStack_70 = (char *)0x0;
    local_98._16_8_ = 0;
    local_98._24_8_ = 0;
    local_98._0_8_ = (pointer)0x0;
    local_98._8_8_ = (char *)0x0;
    this_00 = &this->m_Signatures;
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>_>_>
    ::resize(this_00,(ulong)UVar9);
    if (UVar9 != 0) {
      lVar10 = 0;
      do {
        pIVar2 = *(IPipelineResourceSignature **)((long)ppSVar7 + lVar10);
        if (pIVar2 == (IPipelineResourceSignature *)0x0) {
          FormatString<char[71]>
                    ((string *)local_b8,
                     (char (*) [71])
                     "This error should\'ve been caught by ValidatePipelineResourceSignatures");
          DebugAssertionFailed
                    ((Char *)local_b8._0_8_,"Initialize",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
                     ,0x116);
          if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
            operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
          }
          pRVar3 = (this_00->
                   super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pObj = (IPipelineResourceSignature *)0x0;
        }
        else {
          pRVar3 = (this_00->
                   super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pObj = pIVar2;
        }
        RefCntAutoPtr<Diligent::IPipelineResourceSignature>::operator=
                  ((RefCntAutoPtr<Diligent::IPipelineResourceSignature> *)
                   ((long)&pRVar3->m_pObject + lVar10),pObj);
        iVar6 = (*(pIVar2->super_IDeviceObject).super_IObject._vptr_IObject[4])(pIVar2);
        *(undefined8 *)(local_98 + lVar10) = *(undefined8 *)CONCAT44(extraout_var,iVar6);
        lVar10 = lVar10 + 8;
      } while ((ulong)UVar9 << 3 != lVar10);
    }
    local_48.m_Start = (TPointer)0x0;
    local_48.m_End = (TPointer)0xffffffff;
    local_48.m_Ptr = (TPointer)0x0;
    PSOSerializer<(Diligent::SerializerMode)2>::SerializeCreateInfo
              (&local_48,CreateInfo,(ConstQual<TPRSNames> *)local_98,(DynamicLinearAllocator *)0x0);
    PSOSerializer<(Diligent::SerializerMode)2>::SerializeAuxData
              (&local_48,&(this->m_Data).Aux,(DynamicLinearAllocator *)0x0);
    Allocator = GetRawAllocator();
    Size = Serializer<(Diligent::SerializerMode)2>::GetSize(&local_48);
    SerializedData::SerializedData((SerializedData *)local_b8,Size,Allocator);
    SerializedData::operator=(&(this->m_Data).Common,(SerializedData *)local_b8);
    SerializedData::~SerializedData((SerializedData *)local_b8);
    local_48.m_Start = (TPointer)(this->m_Data).Common.m_Ptr;
    local_48.m_End = local_48.m_Start + (this->m_Data).Common.m_Size;
    Args_1 = (char (*) [14])0x0;
    local_48.m_Ptr = local_48.m_Start;
    PSOSerializer<(Diligent::SerializerMode)1>::SerializeCreateInfo
              ((Serializer<(Diligent::SerializerMode)1> *)&local_48,CreateInfo,
               (ConstQual<TPRSNames> *)local_98,(DynamicLinearAllocator *)0x0);
    PSOSerializer<(Diligent::SerializerMode)1>::SerializeAuxData
              ((Serializer<(Diligent::SerializerMode)1> *)&local_48,&(this->m_Data).Aux,
               (DynamicLinearAllocator *)0x0);
    if (local_48.m_Ptr != local_48.m_End) {
      FormatString<char[26],char[14]>
                ((string *)local_b8,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x7f2690
                 ,Args_1);
      DebugAssertionFailed
                ((Char *)local_b8._0_8_,"Initialize",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
                 ,299);
      if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
        operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
      }
    }
  }
  LOCK();
  (this->m_Status)._M_i = PIPELINE_STATE_STATUS_READY;
  UNLOCK();
  return;
}

Assistant:

void SerializedPipelineStateImpl::Initialize(const PSOCreateInfoType&        CreateInfo,
                                             const PipelineStateArchiveInfo& ArchiveInfo)
{
    auto DeviceBits = ArchiveInfo.DeviceFlags;
    if ((DeviceBits & ARCHIVE_DEVICE_DATA_FLAG_GL) != 0 && (DeviceBits & ARCHIVE_DEVICE_DATA_FLAG_GLES) != 0)
    {
        // OpenGL and GLES use the same device data. Clear one flag to avoid shader duplication.
        DeviceBits &= ~ARCHIVE_DEVICE_DATA_FLAG_GLES;
    }

    m_Data.Aux.NoShaderReflection = (ArchiveInfo.PSOFlags & PSO_ARCHIVE_FLAG_STRIP_REFLECTION) != 0;
    while (DeviceBits != 0)
    {
        const auto Flag = ExtractLSB(DeviceBits);

        static_assert(ARCHIVE_DEVICE_DATA_FLAG_LAST == 1 << 7, "Please update the switch below to handle the new data type");
        switch (Flag)
        {
#if D3D11_SUPPORTED
            case ARCHIVE_DEVICE_DATA_FLAG_D3D11:
                PatchShadersD3D11(CreateInfo);
                break;
#endif
#if D3D12_SUPPORTED
            case ARCHIVE_DEVICE_DATA_FLAG_D3D12:
                PatchShadersD3D12(CreateInfo);
                break;
#endif
#if GL_SUPPORTED || GLES_SUPPORTED
            case ARCHIVE_DEVICE_DATA_FLAG_GL:
            case ARCHIVE_DEVICE_DATA_FLAG_GLES:
                PatchShadersGL(CreateInfo);
                break;
#endif
#if VULKAN_SUPPORTED
            case ARCHIVE_DEVICE_DATA_FLAG_VULKAN:
                PatchShadersVk(CreateInfo);
                break;
#endif
#if METAL_SUPPORTED
            case ARCHIVE_DEVICE_DATA_FLAG_METAL_MACOS:
            case ARCHIVE_DEVICE_DATA_FLAG_METAL_IOS:
                PatchShadersMtl(CreateInfo, ArchiveDeviceDataFlagToArchiveDeviceType(Flag),
                                GetPSODumpFolder(m_pSerializationDevice->GetMtlProperties().DumpFolder, GetDesc(), Flag));
                break;
#endif
#if WEBGPU_SUPPORTED
            case ARCHIVE_DEVICE_DATA_FLAG_WEBGPU:
                PatchShadersWebGPU(CreateInfo);
                break;
#endif
            case ARCHIVE_DEVICE_DATA_FLAG_NONE:
                UNEXPECTED("ARCHIVE_DEVICE_DATA_FLAG_NONE (0) should never occur");
                break;

            default:
                LOG_ERROR_MESSAGE("Unexpected render device type");
                break;
        }
    }

    if (!m_Data.Common)
    {
        if (CreateInfo.ResourceSignaturesCount == 0)
        {
#if GL_SUPPORTED || GLES_SUPPORTED
            if (ArchiveInfo.DeviceFlags & (ARCHIVE_DEVICE_DATA_FLAG_GL | ARCHIVE_DEVICE_DATA_FLAG_GLES))
            {
                // We must add empty device signature for OpenGL after all other devices are processed,
                // otherwise this empty description will be used as common signature description.
                PrepareDefaultSignatureGL(CreateInfo);
            }
#endif
        }
        else
        {
            m_Data.DoNotPackSignatures = (ArchiveInfo.PSOFlags & PSO_ARCHIVE_FLAG_DO_NOT_PACK_SIGNATURES) != 0;
        }

        auto   SignaturesCount = CreateInfo.ResourceSignaturesCount;
        auto** ppSignatures    = CreateInfo.ppResourceSignatures;

        IPipelineResourceSignature* DefaultSignatures[1] = {};
        if (m_pDefaultSignature)
        {
            DefaultSignatures[0] = m_pDefaultSignature;
            ppSignatures         = DefaultSignatures;
            SignaturesCount      = 1;
        }

        TPRSNames PRSNames = {};
        m_Signatures.resize(SignaturesCount);
        for (Uint32 i = 0; i < SignaturesCount; ++i)
        {
            auto* pSignature = ppSignatures[i];
            VERIFY(pSignature != nullptr, "This error should've been caught by ValidatePipelineResourceSignatures");
            m_Signatures[i] = pSignature;
            PRSNames[i]     = pSignature->GetDesc().Name;
        }

        auto SerializePsoCI = [&](auto& Ser) //
        {
            SerializePSOCreateInfo(Ser, CreateInfo, PRSNames);
            constexpr auto SerMode = std::remove_reference<decltype(Ser)>::type::GetMode();
            PSOSerializer<SerMode>::SerializeAuxData(Ser, m_Data.Aux, nullptr);
        };

        {
            Serializer<SerializerMode::Measure> Ser;
            SerializePsoCI(Ser);
            m_Data.Common = Ser.AllocateData(GetRawAllocator());
        }

        {
            Serializer<SerializerMode::Write> Ser{m_Data.Common};
            SerializePsoCI(Ser);
            VERIFY_EXPR(Ser.IsEnded());
        }
    }

    m_Status.store(PIPELINE_STATE_STATUS_READY);
}